

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

void __thiscall
sc_core::sc_trace_file_base::timestamp_in_trace_units
          (sc_trace_file_base *this,unit_type *high,unit_type *low)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  sc_time *psVar4;
  uint64 uVar5;
  unit_type uVar6;
  ulong uVar7;
  
  psVar4 = sc_time_stamp();
  uVar1 = psVar4->m_value;
  uVar5 = sc_delta_count_at_current_time();
  uVar2 = this->trace_unit_fs;
  uVar3 = this->kernel_unit_fs;
  if (uVar2 < uVar3) {
    *low = 0;
    *high = uVar1;
    if (this->trace_delta_cycles_ != true) {
      return;
    }
    *low = *low + uVar5 % (uVar3 / uVar2);
    uVar6 = uVar5 / (uVar3 / uVar2) + *high;
  }
  else {
    uVar7 = uVar1 / (uVar2 / uVar3);
    *low = uVar1 % (uVar2 / uVar3);
    *high = uVar7;
    if (this->trace_delta_cycles_ != true) {
      return;
    }
    uVar6 = uVar7 + uVar5;
  }
  *high = uVar6;
  return;
}

Assistant:

void
sc_trace_file_base::timestamp_in_trace_units(unit_type &high, unit_type &low) const
{
    unit_type time_now = sc_time_stamp().value();
    unit_type delta_now = sc_delta_count_at_current_time();

    if (has_low_units()) {
        unit_type max_low_units = kernel_unit_fs / trace_unit_fs;
        low = 0;
        high = time_now;

        if (delta_cycles()) {
            low += delta_now % max_low_units;
            high += delta_now / max_low_units;
        }

    } else {
        unit_type unit_divisor = trace_unit_fs / kernel_unit_fs;
        low = time_now % unit_divisor;
        high = time_now / unit_divisor;

        if (delta_cycles())
            high += delta_now;
    }
}